

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rolemaskproxymodel.cpp
# Opt level: O0

void __thiscall tst_RoleMaskProxyModel::testRemoveRows_data(tst_RoleMaskProxyModel *this)

{
  QAbstractItemModel *pQVar1;
  QTestData *pQVar2;
  QModelIndex local_288;
  QModelIndex local_270;
  QModelIndex local_258;
  undefined1 local_240 [28];
  int local_224;
  QModelIndex local_220;
  QModelIndex local_208;
  int local_1ec;
  QModelIndex local_1e8;
  QModelIndex local_1d0;
  int local_1b4;
  QModelIndex local_1b0;
  int local_194;
  QAbstractItemModel *local_190;
  QModelIndex local_188;
  int local_16c;
  QAbstractItemModel *local_168;
  QModelIndex local_160;
  int local_144;
  QAbstractItemModel *local_140;
  QModelIndex local_138;
  QModelIndex local_120;
  int local_104;
  QModelIndex local_100;
  QModelIndex local_e8;
  int local_cc;
  QModelIndex local_c8;
  QModelIndex local_b0;
  int local_94;
  QAbstractItemModel *local_90;
  QAbstractItemModel *baseModel;
  int local_6c;
  QAbstractItemModel *local_68;
  QModelIndex local_60;
  int local_44;
  QAbstractItemModel *local_40;
  QModelIndex local_38;
  int local_1c;
  QAbstractItemModel *local_18;
  tst_RoleMaskProxyModel *local_10;
  tst_RoleMaskProxyModel *this_local;
  
  local_10 = this;
  QTest::addColumn<QAbstractItemModel*>("baseModel",(QAbstractItemModel **)0x0);
  QTest::addColumn<int>("removeIndex",(int *)0x0);
  QTest::addColumn<QModelIndex>("parentIndex",(QModelIndex *)0x0);
  pQVar2 = (QTestData *)QTest::newRow("List Remove Begin");
  local_18 = createListModel(&this->super_QObject);
  pQVar2 = ::operator<<(pQVar2,&local_18);
  local_1c = 0;
  pQVar2 = ::operator<<(pQVar2,&local_1c);
  QModelIndex::QModelIndex(&local_38);
  ::operator<<(pQVar2,&local_38);
  pQVar2 = (QTestData *)QTest::newRow("Table Remove Begin");
  local_40 = createTableModel(&this->super_QObject);
  pQVar2 = ::operator<<(pQVar2,&local_40);
  local_44 = 0;
  pQVar2 = ::operator<<(pQVar2,&local_44);
  QModelIndex::QModelIndex(&local_60);
  ::operator<<(pQVar2,&local_60);
  pQVar2 = (QTestData *)QTest::newRow("Tree Remove Begin");
  local_68 = createTreeModel(&this->super_QObject);
  pQVar2 = ::operator<<(pQVar2,&local_68);
  local_6c = 0;
  pQVar2 = ::operator<<(pQVar2,&local_6c);
  QModelIndex::QModelIndex((QModelIndex *)&baseModel);
  ::operator<<(pQVar2,(QModelIndex *)&baseModel);
  local_90 = createListModel(&this->super_QObject);
  pQVar2 = (QTestData *)QTest::newRow("List Remove End");
  pQVar2 = ::operator<<(pQVar2,&local_90);
  pQVar1 = local_90;
  QModelIndex::QModelIndex(&local_b0);
  local_94 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,&local_b0);
  local_94 = local_94 + -1;
  pQVar2 = ::operator<<(pQVar2,&local_94);
  QModelIndex::QModelIndex(&local_c8);
  ::operator<<(pQVar2,&local_c8);
  local_90 = createTableModel(&this->super_QObject);
  if (local_90 != (QAbstractItemModel *)0x0) {
    pQVar2 = (QTestData *)QTest::newRow("Table Remove End");
    pQVar2 = ::operator<<(pQVar2,&local_90);
    pQVar1 = local_90;
    QModelIndex::QModelIndex(&local_e8);
    local_cc = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,&local_e8);
    local_cc = local_cc + -1;
    pQVar2 = ::operator<<(pQVar2,&local_cc);
    QModelIndex::QModelIndex(&local_100);
    ::operator<<(pQVar2,&local_100);
  }
  local_90 = createTreeModel(&this->super_QObject);
  if (local_90 != (QAbstractItemModel *)0x0) {
    pQVar2 = (QTestData *)QTest::newRow("Tree Remove End");
    pQVar2 = ::operator<<(pQVar2,&local_90);
    pQVar1 = local_90;
    QModelIndex::QModelIndex(&local_120);
    local_104 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,&local_120);
    local_104 = local_104 + -1;
    pQVar2 = ::operator<<(pQVar2,&local_104);
    QModelIndex::QModelIndex(&local_138);
    ::operator<<(pQVar2,&local_138);
  }
  pQVar2 = (QTestData *)QTest::newRow("List Remove Middle");
  local_140 = createListModel(&this->super_QObject);
  pQVar2 = ::operator<<(pQVar2,&local_140);
  local_144 = 2;
  pQVar2 = ::operator<<(pQVar2,&local_144);
  QModelIndex::QModelIndex(&local_160);
  ::operator<<(pQVar2,&local_160);
  pQVar2 = (QTestData *)QTest::newRow("Table Remove Middle");
  local_168 = createTableModel(&this->super_QObject);
  pQVar2 = ::operator<<(pQVar2,&local_168);
  local_16c = 2;
  pQVar2 = ::operator<<(pQVar2,&local_16c);
  QModelIndex::QModelIndex(&local_188);
  ::operator<<(pQVar2,&local_188);
  pQVar2 = (QTestData *)QTest::newRow("Tree Remove Middle");
  local_190 = createTreeModel(&this->super_QObject);
  pQVar2 = ::operator<<(pQVar2,&local_190);
  local_194 = 2;
  pQVar2 = ::operator<<(pQVar2,&local_194);
  QModelIndex::QModelIndex(&local_1b0);
  ::operator<<(pQVar2,&local_1b0);
  local_90 = createTreeModel(&this->super_QObject);
  if (local_90 != (QAbstractItemModel *)0x0) {
    pQVar2 = (QTestData *)QTest::newRow("Tree Remove Begin Child");
    pQVar2 = ::operator<<(pQVar2,&local_90);
    local_1b4 = 0;
    pQVar2 = ::operator<<(pQVar2,&local_1b4);
    pQVar1 = local_90;
    QModelIndex::QModelIndex(&local_1e8);
    (**(code **)(*(long *)pQVar1 + 0x60))(&local_1d0,pQVar1,0,0,&local_1e8);
    ::operator<<(pQVar2,&local_1d0);
  }
  local_90 = createTreeModel(&this->super_QObject);
  if (local_90 != (QAbstractItemModel *)0x0) {
    pQVar2 = (QTestData *)QTest::newRow("Tree Remove Middle Child");
    pQVar2 = ::operator<<(pQVar2,&local_90);
    local_1ec = 2;
    pQVar2 = ::operator<<(pQVar2,&local_1ec);
    pQVar1 = local_90;
    QModelIndex::QModelIndex(&local_220);
    (**(code **)(*(long *)pQVar1 + 0x60))(&local_208,pQVar1,0,0,&local_220);
    ::operator<<(pQVar2,&local_208);
  }
  local_90 = createTreeModel(&this->super_QObject);
  if (local_90 != (QAbstractItemModel *)0x0) {
    pQVar2 = (QTestData *)QTest::newRow("Tree Remove End Child");
    pQVar2 = ::operator<<(pQVar2,&local_90);
    pQVar1 = local_90;
    QModelIndex::QModelIndex(&local_258);
    (**(code **)(*(long *)pQVar1 + 0x60))(local_240,pQVar1,0,0,&local_258);
    local_224 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,local_240);
    local_224 = local_224 + -1;
    pQVar2 = ::operator<<(pQVar2,&local_224);
    pQVar1 = local_90;
    QModelIndex::QModelIndex(&local_288);
    (**(code **)(*(long *)pQVar1 + 0x60))(&local_270,pQVar1,0,0,&local_288);
    ::operator<<(pQVar2,&local_270);
  }
  return;
}

Assistant:

void tst_RoleMaskProxyModel::testRemoveRows_data()
{
    QTest::addColumn<QAbstractItemModel *>("baseModel");
    QTest::addColumn<int>("removeIndex");
    QTest::addColumn<QModelIndex>("parentIndex");
    QTest::newRow("List Remove Begin") << createListModel(this) << 0 << QModelIndex();
    QTest::newRow("Table Remove Begin") << createTableModel(this) << 0 << QModelIndex();
    QTest::newRow("Tree Remove Begin") << createTreeModel(this) << 0 << QModelIndex();
    QAbstractItemModel *baseModel = createListModel(this);
    QTest::newRow("List Remove End") << baseModel << baseModel->rowCount() - 1 << QModelIndex();
    baseModel = createTableModel(this);
    if (baseModel)
        QTest::newRow("Table Remove End") << baseModel << baseModel->rowCount() - 1 << QModelIndex();
    baseModel = createTreeModel(this);
    if (baseModel)
        QTest::newRow("Tree Remove End") << baseModel << baseModel->rowCount() - 1 << QModelIndex();
    QTest::newRow("List Remove Middle") << createListModel(this) << 2 << QModelIndex();
    QTest::newRow("Table Remove Middle") << createTableModel(this) << 2 << QModelIndex();
    QTest::newRow("Tree Remove Middle") << createTreeModel(this) << 2 << QModelIndex();

    baseModel = createTreeModel(this);
    if (baseModel)
        QTest::newRow("Tree Remove Begin Child") << baseModel << 0 << baseModel->index(0, 0);
    baseModel = createTreeModel(this);
    if (baseModel)
        QTest::newRow("Tree Remove Middle Child") << baseModel << 2 << baseModel->index(0, 0);
    baseModel = createTreeModel(this);
    if (baseModel)
        QTest::newRow("Tree Remove End Child") << baseModel << baseModel->rowCount(baseModel->index(0, 0)) - 1 << baseModel->index(0, 0);
}